

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

int __thiscall Fl_Tree_Item::find_child(Fl_Tree_Item *this,char *name)

{
  Fl_Tree_Item **ppFVar1;
  char *__s1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if ((name != (char *)0x0) && (lVar4 = (long)(this->_children)._total, 0 < lVar4)) {
    ppFVar1 = (this->_children)._items;
    lVar3 = 0;
    do {
      __s1 = ppFVar1[lVar3]->_label;
      if ((__s1 != (char *)0x0) && (iVar2 = strcmp(__s1,name), iVar2 == 0)) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  return -1;
}

Assistant:

int Fl_Tree_Item::find_child(const char *name) {
  if ( name ) {
    for ( int t=0; t<children(); t++ )
      if ( child(t)->label() )
        if ( strcmp(child(t)->label(), name) == 0 )
          return(t);
  }
  return(-1);
}